

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSG.cpp
# Opt level: O1

void __thiscall POSG::SetNrAgents(POSG *this,size_t nrAgents)

{
  allocator_type local_31;
  value_type_conflict3 local_30;
  vector<Globals::reward_t,_std::allocator<Globals::reward_t>_> local_28;
  
  if (this->_m_initialized == true) {
    this->_m_initialized = false;
    this->_m_nrAgents = nrAgents;
  }
  local_30 = 1.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_28,this->_m_nrAgents,&local_30,
             &local_31);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->_m_discount,&local_28);
  if (local_28.super__Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_30 = (value_type_conflict3)((ulong)local_30 & 0xffffffff00000000);
  std::vector<Globals::reward_t,_std::allocator<Globals::reward_t>_>::vector
            (&local_28,this->_m_nrAgents,(value_type *)&local_30,(allocator_type *)&local_31);
  std::vector<Globals::reward_t,_std::allocator<Globals::reward_t>_>::_M_move_assign
            (&this->_m_rewardType,&local_28);
  if (local_28.super__Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void POSG::SetNrAgents (size_t nrAgents)
{
    if(_m_initialized)
    {
        //do some de-initialization things ?
        _m_initialized = false;
        _m_nrAgents = nrAgents;
    }    

    _m_discount = vector<double>(_m_nrAgents, 1.0);
    _m_rewardType = vector<reward_t>(_m_nrAgents, REWARD);

}